

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS ref_metric_hessian_filter(REF_DBL *metric,REF_GRID ref_grid)

{
  double *pdVar1;
  uint uVar2;
  double dVar3;
  REF_DBL local_220;
  REF_DBL local_218;
  double local_210;
  double local_208;
  double local_200;
  REF_DBL local_1f8;
  double local_1f0;
  double local_1e8;
  double local_1e0;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_DBL diag_2 [12];
  REF_STATUS ref_private_macro_code_rss_8;
  REF_DBL h2;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_DBL diag_1 [12];
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL diag [12];
  int local_6c;
  REF_INT node;
  REF_DBL eig;
  REF_DBL max_valid;
  REF_DBL max_threshold;
  REF_DBL temp;
  REF_DBL *threshold;
  REF_DBL *hess_min_h;
  REF_DBL *min_h;
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  REF_GRID ref_grid_local;
  REF_DBL *metric_local;
  
  ref_mpi = (REF_MPI)ref_grid->node;
  min_h = (REF_DBL *)ref_grid->mpi;
  ref_node = (REF_NODE)ref_grid;
  ref_grid_local = (REF_GRID)metric;
  if (((REF_NODE)ref_mpi)->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x394,
           "ref_metric_hessian_filter","malloc min_h of REF_DBL negative");
    metric_local._4_4_ = 1;
  }
  else {
    hess_min_h = (REF_DBL *)malloc((long)((REF_NODE)ref_mpi)->max << 3);
    if (hess_min_h == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x394,"ref_metric_hessian_filter","malloc min_h of REF_DBL NULL");
      metric_local._4_4_ = 2;
    }
    else if (ref_mpi->id * 6 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x395,"ref_metric_hessian_filter","malloc hess_min_h of REF_DBL negative");
      metric_local._4_4_ = 1;
    }
    else {
      threshold = (REF_DBL *)malloc((long)(ref_mpi->id * 6) << 3);
      if (threshold == (REF_DBL *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x395,"ref_metric_hessian_filter","malloc hess_min_h of REF_DBL NULL");
        metric_local._4_4_ = 2;
      }
      else if (ref_mpi->id < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x396,"ref_metric_hessian_filter","malloc threshold of REF_DBL negative");
        metric_local._4_4_ = 1;
      }
      else {
        temp = (REF_DBL)malloc((long)ref_mpi->id << 3);
        if ((void *)temp == (void *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x396,"ref_metric_hessian_filter","malloc threshold of REF_DBL NULL");
          metric_local._4_4_ = 2;
        }
        else {
          for (local_6c = 0; local_6c < ref_mpi->id; local_6c = local_6c + 1) {
            if (((-1 < local_6c) && (local_6c < ref_mpi->id)) &&
               (-1 < *(long *)((long)ref_mpi->comm + (long)local_6c * 8))) {
              uVar2 = ref_matrix_diag_m((REF_DBL *)
                                        (ref_grid_local->cell + (long)(local_6c * 6) + -2),
                                        (REF_DBL *)&ref_private_macro_code_rss_1);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x39a,"ref_metric_hessian_filter",(ulong)uVar2,"decomp");
                return uVar2;
              }
              if ((int)ref_node[1].old_n_global == 0) {
                diag_1[0xb]._4_4_ =
                     ref_matrix_descending_eig((REF_DBL *)&ref_private_macro_code_rss_1);
                if (diag_1[0xb]._4_4_ != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x39e,"ref_metric_hessian_filter",(ulong)diag_1[0xb]._4_4_,"3D ascend");
                  return diag_1[0xb]._4_4_;
                }
                diag_1[0xb]._4_4_ = 0;
              }
              else {
                uVar2 = ref_matrix_descending_eig_twod((REF_DBL *)&ref_private_macro_code_rss_1);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x39c,"ref_metric_hessian_filter",(ulong)uVar2,"2D ascend");
                  return uVar2;
                }
              }
              if (0.0 <= _ref_private_macro_code_rss_1) {
                local_1e0 = _ref_private_macro_code_rss_1;
              }
              else {
                local_1e0 = 0.0;
              }
              dVar3 = sqrt(local_1e0);
              hess_min_h[local_6c] = dVar3;
              if (hess_min_h[local_6c] * 1e+20 <= 0.0) {
                local_1e8 = -(hess_min_h[local_6c] * 1e+20);
              }
              else {
                local_1e8 = hess_min_h[local_6c] * 1e+20;
              }
              if (local_1e8 <= 1.0) {
                hess_min_h[local_6c] = 1e+200;
              }
              else {
                hess_min_h[local_6c] = 1.0 / hess_min_h[local_6c];
              }
            }
          }
          diag_1[0xb]._0_4_ =
               ref_recon_hessian((REF_GRID)ref_node,hess_min_h,threshold,REF_RECON_L2PROJECTION);
          if (diag_1[0xb]._0_4_ == 0) {
            max_valid = 0.0;
            diag_1[0xb]._0_4_ = 0;
            for (local_6c = 0; local_6c < ref_mpi->id; local_6c = local_6c + 1) {
              if (((-1 < local_6c) && (local_6c < ref_mpi->id)) &&
                 (-1 < *(long *)((long)ref_mpi->comm + (long)local_6c * 8))) {
                uVar2 = ref_matrix_diag_m(threshold + local_6c * 6,
                                          (REF_DBL *)&ref_private_macro_code_rss_5);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x3ae,"ref_metric_hessian_filter",(ulong)uVar2,"decomp");
                  return uVar2;
                }
                if ((int)ref_node[1].old_n_global == 0) {
                  uVar2 = ref_matrix_descending_eig((REF_DBL *)&ref_private_macro_code_rss_5);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,0x3b2,"ref_metric_hessian_filter",(ulong)uVar2,"3D ascend");
                    return uVar2;
                  }
                }
                else {
                  uVar2 = ref_matrix_descending_eig_twod((REF_DBL *)&ref_private_macro_code_rss_5);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,0x3b0,"ref_metric_hessian_filter",(ulong)uVar2,"2D ascend");
                    return uVar2;
                  }
                }
                if (_ref_private_macro_code_rss_5 <= 0.0) {
                  local_1f0 = -_ref_private_macro_code_rss_5;
                }
                else {
                  local_1f0 = _ref_private_macro_code_rss_5;
                }
                dVar3 = log10(local_1f0);
                *(double *)((long)temp + (long)local_6c * 8) = dVar3;
                pdVar1 = (double *)((long)temp + (long)local_6c * 8);
                if (max_valid < *pdVar1 || max_valid == *pdVar1) {
                  local_1f8 = *(REF_DBL *)((long)temp + (long)local_6c * 8);
                }
                else {
                  local_1f8 = max_valid;
                }
                max_valid = local_1f8;
              }
            }
            max_threshold = max_valid;
            uVar2 = ref_mpi_max((REF_MPI)min_h,&max_threshold,&max_valid,3);
            if (uVar2 == 0) {
              max_valid = max_valid * 0.5;
              eig = 0.0;
              for (local_6c = 0; local_6c < ref_mpi->id; local_6c = local_6c + 1) {
                if (((-1 < local_6c) && (local_6c < ref_mpi->id)) &&
                   ((-1 < *(long *)((long)ref_mpi->comm + (long)local_6c * 8) &&
                    (*(double *)((long)temp + (long)local_6c * 8) < max_valid)))) {
                  local_208 = hess_min_h[local_6c] * hess_min_h[local_6c];
                  if (local_208 * 1e+20 <= 0.0) {
                    local_200 = -(local_208 * 1e+20);
                  }
                  else {
                    local_200 = local_208 * 1e+20;
                  }
                  if (1.0 < local_200) {
                    local_208 = 1.0 / local_208;
                    if (local_208 < eig) {
                      local_208 = eig;
                    }
                    eig = local_208;
                  }
                }
              }
              max_threshold = eig;
              diag_2[0xb]._4_4_ = ref_mpi_max((REF_MPI)min_h,&max_threshold,&eig,3);
              if (diag_2[0xb]._4_4_ == 0) {
                diag_2[0xb]._4_4_ = 0;
                for (local_6c = 0; local_6c < ref_mpi->id; local_6c = local_6c + 1) {
                  if (((-1 < local_6c) && (local_6c < ref_mpi->id)) &&
                     (-1 < *(long *)((long)ref_mpi->comm + (long)local_6c * 8))) {
                    uVar2 = ref_matrix_diag_m((REF_DBL *)
                                              (ref_grid_local->cell + (long)(local_6c * 6) + -2),
                                              (REF_DBL *)&ref_private_macro_code_rss_10);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                             ,0x3cd,"ref_metric_hessian_filter",(ulong)uVar2,"decomp");
                      return uVar2;
                    }
                    if ((int)ref_node[1].old_n_global == 0) {
                      uVar2 = ref_matrix_descending_eig((REF_DBL *)&ref_private_macro_code_rss_10);
                      if (uVar2 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                               ,0x3d1,"ref_metric_hessian_filter",(ulong)uVar2,"3D ascend");
                        return uVar2;
                      }
                    }
                    else {
                      uVar2 = ref_matrix_descending_eig_twod
                                        ((REF_DBL *)&ref_private_macro_code_rss_10);
                      if (uVar2 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                               ,0x3cf,"ref_metric_hessian_filter",(ulong)uVar2,"2D ascend");
                        return uVar2;
                      }
                    }
                    if (eig <= _ref_private_macro_code_rss_10) {
                      local_210 = eig;
                    }
                    else {
                      local_210 = _ref_private_macro_code_rss_10;
                    }
                    _ref_private_macro_code_rss_10 = local_210;
                    if (eig <= diag_2[0]) {
                      local_218 = eig;
                    }
                    else {
                      local_218 = diag_2[0];
                    }
                    diag_2[0] = local_218;
                    if ((int)ref_node[1].old_n_global == 0) {
                      if (eig <= diag_2[1]) {
                        local_220 = eig;
                      }
                      else {
                        local_220 = diag_2[1];
                      }
                      diag_2[1] = local_220;
                    }
                    uVar2 = ref_matrix_form_m((REF_DBL *)&ref_private_macro_code_rss_10,
                                              (REF_DBL *)
                                              (ref_grid_local->cell + (long)(local_6c * 6) + -2));
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                             ,0x3d7,"ref_metric_hessian_filter",(ulong)uVar2,"reform");
                      return uVar2;
                    }
                  }
                }
                if (temp != 0.0) {
                  free((void *)temp);
                }
                if (threshold != (REF_DBL *)0x0) {
                  free(threshold);
                }
                if (hess_min_h != (REF_DBL *)0x0) {
                  free(hess_min_h);
                }
                metric_local._4_4_ = 0;
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x3c7,"ref_metric_hessian_filter",(ulong)diag_2[0xb]._4_4_,"max");
                metric_local._4_4_ = diag_2[0xb]._4_4_;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0x3b8,"ref_metric_hessian_filter",(ulong)uVar2,"max");
              metric_local._4_4_ = uVar2;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x3a9,"ref_metric_hessian_filter",(ulong)diag_1[0xb]._0_4_,"hess");
            metric_local._4_4_ = diag_1[0xb]._0_4_;
          }
        }
      }
    }
  }
  return metric_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_metric_hessian_filter(REF_DBL *metric,
                                             REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_DBL *min_h, *hess_min_h, *threshold;
  REF_DBL temp, max_threshold, max_valid, eig;
  REF_INT node;
  ref_malloc(min_h, ref_node_max(ref_node), REF_DBL);
  ref_malloc(hess_min_h, 6 * ref_node_max(ref_node), REF_DBL);
  ref_malloc(threshold, ref_node_max(ref_node), REF_DBL);

  each_ref_node_valid_node(ref_node, node) {
    REF_DBL diag[12];
    RSS(ref_matrix_diag_m(&(metric[6 * node]), diag), "decomp");
    if (ref_grid_twod(ref_grid)) {
      RSS(ref_matrix_descending_eig_twod(diag), "2D ascend");
    } else {
      RSS(ref_matrix_descending_eig(diag), "3D ascend");
    }
    min_h[node] = sqrt(MAX(0.0, ref_matrix_eig(diag, 0)));
    if (ref_math_divisible(1.0, min_h[node])) {
      min_h[node] = 1.0 / min_h[node];
    } else {
      min_h[node] = REF_DBL_MAX;
    }
  }

  RSS(ref_recon_hessian(ref_grid, min_h, hess_min_h, REF_RECON_L2PROJECTION),
      "hess");

  max_threshold = 0.0;
  each_ref_node_valid_node(ref_node, node) {
    REF_DBL diag[12];
    RSS(ref_matrix_diag_m(&(hess_min_h[6 * node]), diag), "decomp");
    if (ref_grid_twod(ref_grid)) {
      RSS(ref_matrix_descending_eig_twod(diag), "2D ascend");
    } else {
      RSS(ref_matrix_descending_eig(diag), "3D ascend");
    }
    threshold[node] = log10(ABS(ref_matrix_eig(diag, 0)));
    max_threshold = MAX(max_threshold, threshold[node]);
  }
  temp = max_threshold;
  RSS(ref_mpi_max(ref_mpi, &temp, &max_threshold, REF_DBL_TYPE), "max");

  /* find the largest valid eigenvalue that is not in a discontinuity */
  max_threshold = 0.5 * max_threshold;
  max_valid = 0.0;
  each_ref_node_valid_node(ref_node, node) {
    if (threshold[node] < max_threshold) {
      REF_DBL h2 = min_h[node] * min_h[node];
      if (ref_math_divisible(1.0, h2)) {
        eig = 1.0 / h2;
        max_valid = MAX(max_valid, eig);
      }
    }
  }
  temp = max_valid;
  RSS(ref_mpi_max(ref_mpi, &temp, &max_valid, REF_DBL_TYPE), "max");

  /* limit hessian eigenvalues everwhere based on what is considered valid
   * outside a discontinuity */
  each_ref_node_valid_node(ref_node, node) {
    REF_DBL diag[12];
    RSS(ref_matrix_diag_m(&(metric[6 * node]), diag), "decomp");
    if (ref_grid_twod(ref_grid)) {
      RSS(ref_matrix_descending_eig_twod(diag), "2D ascend");
    } else {
      RSS(ref_matrix_descending_eig(diag), "3D ascend");
    }
    ref_matrix_eig(diag, 0) = MIN(ref_matrix_eig(diag, 0), max_valid);
    ref_matrix_eig(diag, 1) = MIN(ref_matrix_eig(diag, 1), max_valid);
    if (!ref_grid_twod(ref_grid))
      ref_matrix_eig(diag, 2) = MIN(ref_matrix_eig(diag, 2), max_valid);
    RSS(ref_matrix_form_m(diag, &(metric[6 * node])), "reform");
  }
  ref_free(threshold);
  ref_free(hess_min_h);
  ref_free(min_h);

  return REF_SUCCESS;
}